

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
::RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                *this)

{
  undefined4 uVar1;
  undefined1 uVar2;
  undefined3 uVar4;
  ParamNameGeneratorFunc *pPVar5;
  bool bVar6;
  undefined1 condition;
  undefined1 uVar7;
  undefined1 uVar8;
  int iVar9;
  pointer pIVar10;
  ulong uVar11;
  element_type *peVar12;
  ostream *poVar13;
  CodeLocation *code_location;
  void *this_00;
  pointer pTVar14;
  undefined4 extraout_var;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  bool in_stack_000000d7;
  CodeLocation *in_stack_000000d8;
  string *in_stack_000000e0;
  string param_name;
  Message test_name_stream;
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string test_suite_name;
  int line;
  char *file;
  ParamNameGeneratorFunc *name_func;
  ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
  generator;
  string *instantiation_name;
  iterator gen_it;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>
  test_info;
  iterator test_it;
  bool generated_instantiations;
  CodeLocation *in_stack_fffffffffffffc68;
  CodeLocation *in_stack_fffffffffffffc70;
  TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>
  *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  Message *in_stack_fffffffffffffca0;
  TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>
  *in_stack_fffffffffffffcb8;
  CodeLocation *in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcd8;
  int line_00;
  char *in_stack_fffffffffffffce0;
  TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>
  *in_stack_fffffffffffffce8;
  GTestLogSeverity severity;
  GTestLog *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd58;
  ostream *in_stack_fffffffffffffd60;
  ostream *in_stack_fffffffffffffd68;
  ostream *in_stack_fffffffffffffd70;
  ostream *in_stack_fffffffffffffd80;
  ostream *in_stack_fffffffffffffd88;
  undefined6 in_stack_fffffffffffffd90;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>
  *in_stack_fffffffffffffe18;
  string local_1c0 [32];
  string local_1a0 [32];
  _Base_ptr local_180;
  undefined1 local_178;
  GTestLog local_170;
  GTestLog local_16c;
  TestParamInfo<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
  local_168;
  string local_130 [3];
  long local_c8;
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  char *local_78;
  ParamNameGeneratorFunc *local_70;
  undefined1 local_58 [16];
  pointer local_48;
  InstantiationInfo *local_40;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>_>
  local_38 [3];
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>
  *local_20;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>_>
  local_18;
  byte local_9;
  undefined4 uVar3;
  
  local_9 = 0;
  local_18._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>
        *)std::
          vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>
          ::begin((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>
                   *)in_stack_fffffffffffffc68);
  uStack_200 = in_stack_fffffffffffffc80;
  uStack_1fc = in_stack_fffffffffffffc84;
  uVar1 = in_stack_fffffffffffffc88;
  uVar3 = in_stack_fffffffffffffc8c;
  uStack_1f0 = in_stack_fffffffffffffc90;
  uStack_1ec = in_stack_fffffffffffffc94;
  while( true ) {
    local_20 = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>
                *)std::
                  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>
                  ::end((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>
                         *)in_stack_fffffffffffffc68);
    bVar6 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc70,
                       (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc68);
    if (!bVar6) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>_>
    ::operator*(&local_18);
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>
    ::shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>
                  *)in_stack_fffffffffffffc70,
                 (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>
                  *)in_stack_fffffffffffffc68);
    local_38[0]._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffc68);
    while( true ) {
      local_40 = (InstantiationInfo *)
                 std::
                 vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>
                 ::end((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>
                        *)in_stack_fffffffffffffc68);
      bVar6 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc70,
                         (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc68);
      if (!bVar6) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>_>
                 ::operator->(local_38);
      pIVar10 = __gnu_cxx::
                __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>_>
                ::operator->(local_38);
      (*pIVar10->generator)(local_58);
      pIVar10 = __gnu_cxx::
                __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>_>
                ::operator->(local_38);
      local_70 = pIVar10->name_func;
      pIVar10 = __gnu_cxx::
                __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>_>
                ::operator->(local_38);
      local_78 = pIVar10->file;
      pIVar10 = __gnu_cxx::
                __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>_>
                ::operator->(local_38);
      local_7c = pIVar10->line;
      std::__cxx11::string::string(local_a0);
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffc98,(char *)CONCAT44(uStack_1ec,uStack_1f0));
        std::__cxx11::string::operator=(local_a0,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      peVar12 = std::
                __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0xd008ce);
      std::__cxx11::string::operator+=(local_a0,(string *)peVar12);
      local_c8 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0xd008f9);
      ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
      ::begin((ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
               *)in_stack_fffffffffffffc78);
      while( true ) {
        ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
        ::end((ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
               *)in_stack_fffffffffffffc78);
        bVar6 = ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                ::operator!=((ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                              *)in_stack_fffffffffffffc70,
                             (ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                              *)in_stack_fffffffffffffc68);
        ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
        ::~ParamIterator((ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                          *)0xd00954);
        iVar9 = (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
        severity = (GTestLogSeverity)((ulong)in_stack_fffffffffffffce8 >> 0x20);
        line_00 = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
        if (!bVar6) break;
        local_9 = 1;
        Message::Message(in_stack_fffffffffffffca0);
        pPVar5 = local_70;
        ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
        ::operator*((ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                     *)0xd009fd);
        TestParamInfo<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
        ::TestParamInfo((TestParamInfo<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                         *)CONCAT44(uStack_1fc,uStack_200),in_stack_fffffffffffffc78,
                        (size_t)in_stack_fffffffffffffc70);
        (*pPVar5)(local_130,&local_168);
        condition = IsValidParamName((string *)in_stack_fffffffffffffc78);
        uVar7 = IsTrue((bool)condition);
        if (!(bool)uVar7) {
          GTestLog::GTestLog(in_stack_fffffffffffffcf0,severity,in_stack_fffffffffffffce0,line_00);
          poVar13 = GTestLog::GetStream(&local_16c);
          in_stack_fffffffffffffd88 =
               std::operator<<(poVar13,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffd80 =
               std::operator<<(in_stack_fffffffffffffd88,"Parameterized test name \'");
          poVar13 = std::operator<<(in_stack_fffffffffffffd80,(string *)local_130);
          in_stack_fffffffffffffd70 = std::operator<<(poVar13,"\' is invalid, in ");
          in_stack_fffffffffffffd68 = std::operator<<(in_stack_fffffffffffffd70,local_78);
          in_stack_fffffffffffffd60 = std::operator<<(in_stack_fffffffffffffd68," line ");
          in_stack_fffffffffffffd58 =
               (char *)std::ostream::operator<<(in_stack_fffffffffffffd60,local_7c);
          std::ostream::operator<<(in_stack_fffffffffffffd58,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc70);
        }
        code_location =
             (CodeLocation *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(uStack_1fc,uStack_200),(key_type *)in_stack_fffffffffffffc78);
        uVar8 = IsTrue(code_location == (CodeLocation *)0x0);
        if (!(bool)uVar8) {
          GTestLog::GTestLog(in_stack_fffffffffffffcf0,severity,in_stack_fffffffffffffce0,line_00);
          poVar13 = GTestLog::GetStream(&local_170);
          poVar13 = std::operator<<(poVar13,
                                    "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar13 = std::operator<<(poVar13,"Duplicate parameterized test name \'");
          poVar13 = std::operator<<(poVar13,(string *)local_130);
          poVar13 = std::operator<<(poVar13,"\', in ");
          poVar13 = std::operator<<(poVar13,local_78);
          poVar13 = std::operator<<(poVar13," line ");
          this_00 = (void *)std::ostream::operator<<(poVar13,local_7c);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc70);
        }
        pVar15 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(uStack_1ec,uStack_1f0),(value_type *)CONCAT44(uVar3,uVar1));
        local_180 = (_Base_ptr)pVar15.first._M_node;
        local_178 = pVar15.second;
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xd00de6);
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0xd00e03);
          Message::operator<<((Message *)in_stack_fffffffffffffc70,&in_stack_fffffffffffffc68->file)
          ;
          Message::operator<<((Message *)in_stack_fffffffffffffc70,
                              (char (*) [2])in_stack_fffffffffffffc68);
        }
        Message::operator<<((Message *)in_stack_fffffffffffffc70,&in_stack_fffffffffffffc68->file);
        in_stack_fffffffffffffcf0 = (GTestLog *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffc78);
        in_stack_fffffffffffffce0 = (char *)std::__cxx11::string::c_str();
        in_stack_fffffffffffffce8 =
             ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
             ::operator*((ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                          *)0xd00e9b);
        PrintToString<(anonymous_namespace)::TestParams<unsigned_long(*)(unsigned_short*,int,unsigned_short*,int,int,int)>>
                  (in_stack_fffffffffffffe18);
        in_stack_fffffffffffffcd8 = std::__cxx11::string::c_str();
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xd00edb);
        CodeLocation::CodeLocation(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        (**(code **)(*in_RDI + 0x18))();
        in_stack_fffffffffffffc68 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
             ::GetSetUpCaseOrSuite((char *)in_stack_fffffffffffffcc0,iVar9);
        in_stack_fffffffffffffc70 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
             ::GetTearDownCaseOrSuite((char *)in_stack_fffffffffffffcc0,iVar9);
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0xd00f4c);
        pTVar14 = std::
                  unique_ptr<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>_>_>
                  ::operator->((unique_ptr<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>_>_>
                                *)0xd00f58);
        in_stack_fffffffffffffcb8 =
             ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
             ::operator*((ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                          *)0xd00f6a);
        uVar1 = in_stack_fffffffffffffcb8->bit_depth;
        uVar2 = in_stack_fffffffffffffcb8->use_high_bit_depth;
        uVar4 = *(undefined3 *)&in_stack_fffffffffffffcb8->field_0x25;
        uVar3 = CONCAT31(uVar4,uVar2);
        uStack_200 = SUB84(in_stack_fffffffffffffcb8->func,0);
        uStack_1fc = (undefined4)((ulong)in_stack_fffffffffffffcb8->func >> 0x20);
        uStack_1f0 = (undefined4)*(undefined8 *)&in_stack_fffffffffffffcb8->mask;
        uStack_1ec = (undefined4)((ulong)*(undefined8 *)&in_stack_fffffffffffffcb8->mask >> 0x20);
        iVar9 = (*pTVar14->_vptr_TestMetaFactoryBase[2])();
        in_stack_fffffffffffffc78 =
             (TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>
              *)CONCAT44(extraout_var,iVar9);
        in_stack_fffffffffffffcc0 = in_stack_fffffffffffffc70;
        MakeAndRegisterTestInfo
                  ((char *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
                   (char *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,code_location,
                   (TypeId)CONCAT17(uVar8,in_stack_fffffffffffffd48),
                   (SetUpTestSuiteFunc)in_stack_fffffffffffffd80,
                   (TearDownTestSuiteFunc)in_stack_fffffffffffffd88,
                   (TestFactoryBase *)CONCAT17(condition,CONCAT16(uVar7,in_stack_fffffffffffffd90)))
        ;
        CodeLocation::~CodeLocation((CodeLocation *)0xd01028);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::~string(local_1a0);
        std::__cxx11::string::~string((string *)local_130);
        Message::~Message((Message *)0xd0105c);
        ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
        ::operator++((ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                      *)in_stack_fffffffffffffc70);
        local_c8 = local_c8 + 1;
      }
      ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
      ::~ParamIterator((ParamIterator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                        *)0xd0096c);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xd01121);
      std::__cxx11::string::~string(local_a0);
      ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
      ::~ParamGenerator((ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
                         *)0xd0113b);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::InstantiationInfo>_>_>
      ::operator++(local_38);
    }
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>
    ::~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>
                   *)0xd01183);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>_>
    ::operator++(&local_18);
  }
  if ((local_9 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))();
    CodeLocation::CodeLocation(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    std::
    vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>
    ::empty((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MseHBDWxHTestClass<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>::TestInfo>_>_>
             *)CONCAT44(uStack_1fc,uStack_200));
    InsertSyntheticTestCase(in_stack_000000e0,in_stack_000000d8,in_stack_000000d7);
    CodeLocation::~CodeLocation((CodeLocation *)0xd0121d);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }